

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

void Smt_PrsFree(Smt_Prs_t *p)

{
  Smt_Prs_t *p_local;
  
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  Vec_IntErase(&p->vStack);
  Vec_WecErase(&p->vObjs);
  if (p != (Smt_Prs_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Smt_PrsFree( Smt_Prs_t * p )
{
    if ( p->pStrs )
        Abc_NamDeref( p->pStrs );
    Vec_IntErase( &p->vStack );
    //Vec_WecErase( &p->vDepth );
    Vec_WecErase( &p->vObjs );
    ABC_FREE( p );
}